

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTests.cpp
# Opt level: O3

void * testAlloc(int size)

{
  int *piVar1;
  bool local_19;
  int *local_18;
  
  testTotalMemoryAlloc = testTotalMemoryAlloc + 1;
  testTotalMemoryRequested = testTotalMemoryRequested + size;
  testTotalMemoryUsed = testTotalMemoryUsed + size;
  piVar1 = (int *)operator_new__((long)(size + 0x80));
  if (-1 < size) {
    piVar1[0x1c] = -0x11111112;
    piVar1[0x1d] = -0x11111112;
    piVar1[0x1e] = -0x11111112;
    piVar1[0x1f] = -0x11111112;
    piVar1[0x19] = -0x11111112;
    piVar1[0x1a] = -0x11111112;
    piVar1[0x1b] = -0x11111112;
    piVar1[0x1c] = -0x11111112;
    piVar1[0x15] = -0x11111112;
    piVar1[0x16] = -0x11111112;
    piVar1[0x17] = -0x11111112;
    piVar1[0x18] = -0x11111112;
    piVar1[0x11] = -0x11111112;
    piVar1[0x12] = -0x11111112;
    piVar1[0x13] = -0x11111112;
    piVar1[0x14] = -0x11111112;
    piVar1[0xd] = -0x11111112;
    piVar1[0xe] = -0x11111112;
    piVar1[0xf] = -0x11111112;
    piVar1[0x10] = -0x11111112;
    piVar1[9] = -0x11111112;
    piVar1[10] = -0x11111112;
    piVar1[0xb] = -0x11111112;
    piVar1[0xc] = -0x11111112;
    piVar1[5] = -0x11111112;
    piVar1[6] = -0x11111112;
    piVar1[7] = -0x11111112;
    piVar1[8] = -0x11111112;
    piVar1[1] = -0x11111112;
    piVar1[2] = -0x11111112;
    piVar1[3] = -0x11111112;
    piVar1[4] = -0x11111112;
    *piVar1 = size;
    local_19 = true;
    local_18 = piVar1;
    SmallDenseMap<unsigned_long,_bool,_PointerHasher,_1024U>::insert
              (&activePoiners,(unsigned_long *)&local_18,&local_19);
    return piVar1 + 0x20;
  }
  __assert_fail("!\"out of memory\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/UnitTests.cpp"
                ,0x68,"void *testAlloc(int)");
}

Assistant:

void* testAlloc(int size)
{
	testTotalMemoryAlloc++;
	testTotalMemoryRequested += size;
	testTotalMemoryUsed += size;

#ifdef ALLOC_TOP_DOWN
	char *ptr = (char*)VirtualAlloc(NULL, size + 128, MEM_COMMIT | MEM_TOP_DOWN, PAGE_READWRITE);
#else
	char *ptr = new char[size + 128];
#endif

	if(size < 0 || !ptr)
	{
		assert(!"out of memory");
		return 0;
	}

	memset(ptr, 0xee, 128);
	*(unsigned*)ptr = size;

	activePoiners.insert(uintptr_t(ptr), 1);

	return ptr + 128;
}